

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O3

int __thiscall Parse::compoundStmt(Parse *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  int iVar3;
  DelimiterTable *pDVar4;
  mapped_type *pmVar5;
  ostream *poVar6;
  key_type local_48;
  
  if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
      super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
    pDVar4 = this->delimiterTable;
    paVar1 = &local_48.field_2;
    local_48._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"{","");
    pmVar5 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&(pDVar4->
                           super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                           ).index,&local_48);
    iVar2 = *pmVar5;
    iVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
            super__Vector_impl_data._M_start[this->curIndex].id;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != paVar1) {
      operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
    }
    if (iVar2 == iVar3) {
      this->curIndex = this->curIndex + 1;
      localDeclarations(this);
      statementList(this);
      if ((this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
          super__Vector_impl_data._M_start[this->curIndex].type == DELIMTER) {
        pDVar4 = this->delimiterTable;
        local_48._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"}","");
        pmVar5 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                 ::operator[](&(pDVar4->
                               super_Table<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               ).index,&local_48);
        iVar2 = *pmVar5;
        iVar3 = (this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)._M_impl.
                super__Vector_impl_data._M_start[this->curIndex].id;
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_48._M_dataplus._M_p != paVar1) {
          operator_delete(local_48._M_dataplus._M_p,local_48.field_2._M_allocated_capacity + 1);
        }
        if (iVar2 == iVar3) {
          this->curIndex = this->curIndex + 1;
          return 1;
        }
      }
      poVar6 = std::operator<<((ostream *)&std::cout,anon_var_dwarf_33bee);
      poVar6 = (ostream *)
               std::ostream::operator<<
                         (poVar6,(this->tokenVec->super__Vector_base<Token,_std::allocator<Token>_>)
                                 ._M_impl.super__Vector_impl_data._M_start[this->curIndex].line + -1
                         );
      poVar6 = std::operator<<(poVar6,anon_var_dwarf_33a7e);
      std::endl<char,std::char_traits<char>>(poVar6);
      exit(0);
    }
  }
  return 0;
}

Assistant:

int Parse::compoundStmt() {
    if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["{"] == tokenVec[curIndex].id) {
        curIndex++;
        localDeclarations();
        statementList();
        if(tokenVec[curIndex].type == DELIMTER && delimiterTable.index["}"] == tokenVec[curIndex].id) {
            curIndex++;
        } else {
            //cout << tokenVec[curIndex].name << endl;
            cout << "函数定义缺少右括号在第" << tokenVec[curIndex].line- 1  << "行" << endl;
            exit(0);
        }
        return 1;
    }
    return 0;
}